

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.h
# Opt level: O1

void __thiscall GdlLanguageDefn::SetCode(GdlLanguageDefn *this,string *staCode)

{
  long *local_38 [2];
  long local_28 [2];
  
  std::__cxx11::string::substr((ulong)local_38,(ulong)staCode);
  std::__cxx11::string::operator=((string *)staCode,(string *)local_38);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  this->m_rgchID[0] = '\0';
  this->m_rgchID[1] = '\0';
  this->m_rgchID[2] = '\0';
  this->m_rgchID[3] = '\0';
  memcpy(this->m_rgchID,(staCode->_M_dataplus)._M_p,staCode->_M_string_length);
  return;
}

Assistant:

void SetCode(std::string staCode)
	{
		Assert(staCode.length() <= 4);
		staCode = staCode.substr(0, 4);
		memset(m_rgchID, 0, sizeof(m_rgchID));
		memcpy(m_rgchID, staCode.data(), staCode.size() * sizeof(char));
	}